

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecdsa_edge_cases(void)

{
  char *pcVar1;
  char cVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar12;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar13;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *extraout_RAX_13;
  secp256k1_context *extraout_RAX_14;
  secp256k1_context *extraout_RAX_15;
  secp256k1_context *extraout_RAX_16;
  secp256k1_ge *r;
  long lVar14;
  uint64_t *unaff_RBP;
  secp256k1_context *ctx;
  code *pcVar15;
  long lVar16;
  secp256k1_gej *r_00;
  secp256k1_scalar *r_01;
  bool bVar17;
  int32_t _calls_to_callback_9;
  secp256k1_scalar ss_2;
  secp256k1_scalar sr;
  secp256k1_scalar ss;
  secp256k1_scalar msg;
  size_t siglen;
  secp256k1_ecdsa_signature sig;
  secp256k1_gej keyj;
  ulong local_4190;
  undefined1 local_4188 [32];
  undefined1 local_4168 [16];
  undefined1 auStack_4158 [16];
  undefined1 local_4148 [8];
  ulong uStack_4140;
  undefined1 auStack_4138 [16];
  uchar *local_4120;
  undefined1 local_4118 [4];
  undefined1 auStack_4114 [12];
  uint64_t local_4108;
  uint64_t uStack_4100;
  uchar local_40f8;
  uint local_40cc;
  size_t local_40c8 [4];
  secp256k1_ge local_40a8;
  secp256k1_gej local_4038 [53];
  uint64_t local_2038 [1025];
  
  _local_4148 = ZEXT816(1);
  auStack_4138 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4148);
  secp256k1_scalar_negate((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4148);
  secp256k1_scalar_inverse((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4148);
  local_4168 = ZEXT816(1);
  auStack_4158 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4168);
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,local_4038,(secp256k1_scalar *)local_4168);
  secp256k1_ge_set_gej(&local_40a8,local_4038);
  local_4108 = auStack_4138._0_8_;
  uStack_4100 = auStack_4138._8_8_;
  _local_4118 = _local_4148;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4168,(secp256k1_scalar *)local_4148,&local_40a8,
                      (secp256k1_scalar *)local_4118);
  if (iVar11 != 0) goto LAB_00152139;
  local_4168 = ZEXT816(1);
  auStack_4158 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4168);
  local_40a8.x.n[2] = 0;
  local_40a8.x.n[3] = 0;
  local_40a8.x.n[0] = 0;
  local_40a8.x.n[1] = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)&local_40a8);
  local_4108 = 0;
  uStack_4100 = 0;
  _local_4118 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4118);
  iVar11 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_001750c0,0x21);
  if (iVar11 == 0) goto LAB_0015213e;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4118,(secp256k1_scalar *)local_4168,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar11 != 0) goto LAB_00152143;
  r = &local_40a8;
  local_40a8.x.n[1] = 0;
  local_40a8.x.n[2] = 0;
  local_40a8.x.n[3] = 0;
  local_40a8.x.n[0] = 2;
  local_40a8.x.n[4]._0_1_ = 1;
  auStack_4138 = ZEXT816(0);
  _local_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4148);
  local_4108 = 0;
  uStack_4100 = 0;
  _local_4118 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4118);
  local_4168 = ZEXT816(1);
  auStack_4158 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4168);
  iVar11 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,(uchar *)r,0x21);
  if (iVar11 == 0) goto LAB_00152148;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4168,(secp256k1_scalar *)local_4148,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4118);
  if (iVar11 != 0) goto LAB_0015214d;
  r = (secp256k1_ge *)local_4118;
  local_4108 = 0;
  uStack_4100 = 0;
  stack0xffffffffffffbee9 = ZEXT715(0);
  local_4118[0] = 2;
  local_40f8 = '\x02';
  local_4188._0_8_ = (_func_void_char_ptr_void_ptr *)0x2;
  local_4188._8_8_ = (void *)0x0;
  local_4188._16_8_ = 0;
  local_4188._24_8_ = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)local_4188);
  auStack_4158 = ZEXT816(0);
  local_4168 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4168);
  _local_4148 = ZEXT816(2);
  auStack_4138 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4148);
  iVar11 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,(uchar *)r,0x21);
  if (iVar11 == 0) goto LAB_00152152;
  iVar11 = secp256k1_eckey_pubkey_parse(&local_40a8,&DAT_001750f0,0x21);
  if (iVar11 == 0) goto LAB_00152157;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4188,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4168);
  if (iVar11 == 0) goto LAB_0015215c;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4188,&local_40a8,
                      (secp256k1_scalar *)local_4168);
  if (iVar11 == 0) goto LAB_00152161;
  r = (secp256k1_ge *)local_4188;
  secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4168);
  if (iVar11 == 0) goto LAB_00152166;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4188,&local_40a8,
                      (secp256k1_scalar *)local_4168);
  if (iVar11 == 0) goto LAB_0015216b;
  local_4188._0_8_ = (_func_void_char_ptr_void_ptr *)0x1;
  local_4188._8_8_ = (void *)0x0;
  local_4188._16_8_ = 0;
  local_4188._24_8_ = 0;
  r = (secp256k1_ge *)local_4188;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4168);
  if (iVar11 != 0) goto LAB_00152170;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4188,&local_40a8,
                      (secp256k1_scalar *)local_4168);
  if (iVar11 != 0) goto LAB_00152175;
  r = (secp256k1_ge *)0x1;
  _local_4148 = ZEXT816(1);
  auStack_4138 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4148);
  _local_4118 = ZEXT816(1);
  local_4108 = 0;
  uStack_4100 = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)local_4118);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4168,"",(int *)0x0);
  iVar11 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00175120,0x21);
  if (iVar11 == 0) goto LAB_0015217a;
  iVar11 = secp256k1_eckey_pubkey_parse(&local_40a8,&DAT_00175150,0x21);
  if (iVar11 == 0) goto LAB_0015217f;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4168,(secp256k1_scalar *)local_4148,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4118);
  if (iVar11 == 0) goto LAB_00152184;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4168,(secp256k1_scalar *)local_4148,&local_40a8,
                      (secp256k1_scalar *)local_4118);
  if (iVar11 == 0) goto LAB_00152189;
  r = (secp256k1_ge *)local_4148;
  secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4168,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4118);
  if (iVar11 == 0) goto LAB_0015218e;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4168,(secp256k1_scalar *)local_4148,&local_40a8,
                      (secp256k1_scalar *)local_4118);
  if (iVar11 == 0) goto LAB_00152193;
  _local_4148 = ZEXT816(2);
  auStack_4138 = ZEXT816(0);
  r = (secp256k1_ge *)local_4148;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4168,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4118);
  if (iVar11 != 0) goto LAB_00152198;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4168,(secp256k1_scalar *)local_4148,&local_40a8,
                      (secp256k1_scalar *)local_4118);
  if (iVar11 != 0) goto LAB_0015219d;
  local_4168 = ZEXT816(1);
  auStack_4158 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4168);
  r = &local_40a8;
  local_40a8.x.n[0] = 1;
  local_40a8.x.n[1] = 0;
  local_40a8.x.n[2] = 0;
  local_40a8.x.n[3] = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4118,"",(int *)0x0);
  iVar11 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00175180,0x21);
  if (iVar11 == 0) goto LAB_001521a2;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4118,(secp256k1_scalar *)local_4168,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar11 == 0) goto LAB_001521a7;
  r = (secp256k1_ge *)local_4168;
  secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4118,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar11 == 0) goto LAB_001521ac;
  local_4168 = ZEXT816(3);
  auStack_4158 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4168);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)local_4168,(secp256k1_scalar *)local_4168);
  r = (secp256k1_ge *)local_4118;
  iVar11 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)r,(secp256k1_scalar *)local_4168,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar11 != 0) goto LAB_001521b1;
  auStack_4158 = ZEXT816((ulong)0x100000000000000) << 0x40;
  local_4168 = ZEXT816(0);
  auStack_4138._8_8_ = 0xa9293eb931dddf65;
  auStack_4138._0_8_ = 0x62777a810be012b8;
  uStack_4140 = 0xf7f478316a9d5faa;
  local_4148 = (undefined1  [8])0x5344230681994186;
  iVar11 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,local_4168,
                      precomputed_nonce_function,"");
  if (iVar11 != 0) goto LAB_001521b6;
  iVar11 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,local_4168,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  if (iVar11 != 0) goto LAB_001521bb;
  auStack_4138[0xf] = 0xaa;
  iVar11 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,local_4168,
                      precomputed_nonce_function,"");
  psVar13 = CTX;
  if (iVar11 != 1) goto LAB_001521c0;
  auVar6._12_4_ = 0;
  auVar6._0_12_ = auStack_4114;
  _local_4118 = auVar6 << 0x20;
  local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
  local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) goto LAB_001521c5;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar13->illegal_callback).data = r;
LAB_00150e52:
  iVar11 = secp256k1_ecdsa_sign
                     (psVar13,(secp256k1_ecdsa_signature *)0x0,local_4148,local_4168,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar13->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4118 != (undefined1  [4])0x1) goto LAB_001521ea;
    auVar7._12_4_ = 0;
    auVar7._0_12_ = auStack_4114;
    _local_4118 = auVar7 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)(psVar13->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_001521ef;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = r;
  }
  else {
    test_ecdsa_edge_cases_cold_12();
LAB_001521ea:
    test_ecdsa_edge_cases_cold_13();
    psVar13 = extraout_RAX_00;
LAB_001521ef:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_sign
                     (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0,local_4168,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar13->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4118 != (undefined1  [4])0x1) goto LAB_00152214;
    auVar8._12_4_ = 0;
    auVar8._0_12_ = auStack_4114;
    _local_4118 = auVar8 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)(psVar13->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_00152219;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = r;
  }
  else {
    test_ecdsa_edge_cases_cold_14();
LAB_00152214:
    test_ecdsa_edge_cases_cold_15();
    psVar13 = extraout_RAX_01;
LAB_00152219:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  pcVar15 = precomputed_nonce_function;
  iVar11 = secp256k1_ecdsa_sign
                     (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,(uchar *)0x0,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar13->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4118 != (undefined1  [4])0x1) goto LAB_0015223e;
    pcVar15 = precomputed_nonce_function;
    iVar11 = secp256k1_ecdsa_sign
                       (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,local_4168,
                        precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar11 != 1) goto LAB_00152243;
    iVar11 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_4118,local_4168);
    psVar13 = CTX;
    if (iVar11 == 0) goto LAB_00152248;
    local_4188._0_8_ = local_4188._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_0015224d;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = local_4188;
  }
  else {
    test_ecdsa_edge_cases_cold_16();
LAB_0015223e:
    test_ecdsa_edge_cases_cold_17();
LAB_00152243:
    test_ecdsa_edge_cases_cold_18();
LAB_00152248:
    test_ecdsa_edge_cases_cold_84();
    psVar13 = extraout_RAX_02;
LAB_0015224d:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_verify
                     (psVar13,(secp256k1_ecdsa_signature *)0x0,local_4148,
                      (secp256k1_pubkey *)local_4118);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar13->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4188._0_4_ != 1) goto LAB_00152272;
    local_4188._0_8_ = local_4188._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar13->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_00152277;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = local_4188;
  }
  else {
    test_ecdsa_edge_cases_cold_19();
LAB_00152272:
    test_ecdsa_edge_cases_cold_20();
    psVar13 = extraout_RAX_03;
LAB_00152277:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_verify
                     (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0,
                      (secp256k1_pubkey *)local_4118);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar13->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4188._0_4_ != 1) goto LAB_0015229c;
    local_4188._0_8_ = local_4188._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar13->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_001522a1;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = local_4188;
  }
  else {
    test_ecdsa_edge_cases_cold_21();
LAB_0015229c:
    test_ecdsa_edge_cases_cold_22();
    psVar13 = extraout_RAX_04;
LAB_001522a1:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_verify
                     (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,
                      (secp256k1_pubkey *)0x0);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar13->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4188._0_4_ != 1) goto LAB_001522c6;
    iVar11 = secp256k1_ecdsa_verify
                       (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,
                        (secp256k1_pubkey *)local_4118);
    psVar13 = CTX;
    if (iVar11 == 0) goto LAB_001522cb;
    local_4188._0_8_ = local_4188._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_001522d0;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = local_4188;
  }
  else {
    test_ecdsa_edge_cases_cold_23();
LAB_001522c6:
    test_ecdsa_edge_cases_cold_24();
LAB_001522cb:
    test_ecdsa_edge_cases_cold_83();
    psVar13 = extraout_RAX_05;
LAB_001522d0:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ec_pubkey_create(psVar13,(secp256k1_pubkey *)local_4118,(uchar *)0x0);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar13->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4188._0_4_ != 1) goto LAB_001522f5;
    local_4188._0_8_ = local_4188._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar13->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_001522fa;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = local_4188;
  }
  else {
    test_ecdsa_edge_cases_cold_25();
LAB_001522f5:
    test_ecdsa_edge_cases_cold_26();
    psVar13 = extraout_RAX_06;
LAB_001522fa:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_verify
                     (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,
                      (secp256k1_pubkey *)local_4118);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar13->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4188._0_4_ != 1) goto LAB_0015231f;
    local_40c8[0] = 0x48;
    local_4188._0_8_ = local_4188._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar13->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_00152324;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = local_4188;
  }
  else {
    test_ecdsa_edge_cases_cold_27();
LAB_0015231f:
    test_ecdsa_edge_cases_cold_28();
    psVar13 = extraout_RAX_07;
LAB_00152324:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_serialize_der
                     (psVar13,(uchar *)0x0,local_40c8,(secp256k1_ecdsa_signature *)&local_40a8);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar13->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4188._0_4_ != 1) goto LAB_00152349;
    local_4190 = local_4190 & 0xffffffff00000000;
    local_4188._0_8_ = (psVar13->illegal_callback).fn;
    local_4188._8_8_ = (psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_0015234e;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = &local_4190;
  }
  else {
    test_ecdsa_edge_cases_cold_29();
LAB_00152349:
    test_ecdsa_edge_cases_cold_30();
    psVar13 = extraout_RAX_08;
LAB_0015234e:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_serialize_der
                     (psVar13,(uchar *)local_4038,(size_t *)0x0,
                      (secp256k1_ecdsa_signature *)&local_40a8);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4188._0_8_;
    (psVar13->illegal_callback).data = (void *)local_4188._8_8_;
    if ((int)local_4190 != 1) goto LAB_00152373;
    local_4190 = local_4190 & 0xffffffff00000000;
    local_4188._0_8_ = (psVar13->illegal_callback).fn;
    local_4188._8_8_ = (psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_00152378;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = &local_4190;
  }
  else {
    test_ecdsa_edge_cases_cold_31();
LAB_00152373:
    test_ecdsa_edge_cases_cold_32();
    psVar13 = extraout_RAX_09;
LAB_00152378:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_serialize_der
                     (psVar13,(uchar *)local_4038,local_40c8,(secp256k1_ecdsa_signature *)0x0);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4188._0_8_;
    (psVar13->illegal_callback).data = (void *)local_4188._8_8_;
    if ((int)local_4190 != 1) goto LAB_0015239d;
    iVar11 = secp256k1_ecdsa_signature_serialize_der
                       (psVar13,(uchar *)local_4038,local_40c8,
                        (secp256k1_ecdsa_signature *)&local_40a8);
    psVar13 = CTX;
    if (iVar11 == 0) goto LAB_001523a2;
    local_4190 = local_4190 & 0xffffffff00000000;
    local_4188._0_8_ = (CTX->illegal_callback).fn;
    local_4188._8_8_ = (CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_001523a7;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = &local_4190;
  }
  else {
    test_ecdsa_edge_cases_cold_33();
LAB_0015239d:
    test_ecdsa_edge_cases_cold_34();
LAB_001523a2:
    test_ecdsa_edge_cases_cold_82();
    psVar13 = extraout_RAX_10;
LAB_001523a7:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_parse_der
                     (psVar13,(secp256k1_ecdsa_signature *)0x0,(uchar *)local_4038,local_40c8[0]);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4188._0_8_;
    (psVar13->illegal_callback).data = (void *)local_4188._8_8_;
    if ((int)local_4190 != 1) goto LAB_001523cc;
    local_4190 = local_4190 & 0xffffffff00000000;
    local_4188._0_8_ = (psVar13->illegal_callback).fn;
    local_4188._8_8_ = (psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_001523d1;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = &local_4190;
  }
  else {
    test_ecdsa_edge_cases_cold_35();
LAB_001523cc:
    test_ecdsa_edge_cases_cold_36();
    psVar13 = extraout_RAX_11;
LAB_001523d1:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_parse_der
                     (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0,local_40c8[0]);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4188._0_8_;
    (psVar13->illegal_callback).data = (void *)local_4188._8_8_;
    if ((int)local_4190 != 1) goto LAB_001523f6;
    iVar11 = secp256k1_ecdsa_signature_parse_der
                       (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)local_4038,
                        local_40c8[0]);
    if (iVar11 == 0) goto LAB_001523fb;
    local_40c8[0] = 10;
    iVar11 = secp256k1_ecdsa_signature_serialize_der
                       (CTX,(uchar *)local_4038,local_40c8,(secp256k1_ecdsa_signature *)&local_40a8)
    ;
    psVar13 = CTX;
    if (iVar11 != 0) goto LAB_00152400;
    local_4190 = local_4190 & 0xffffffff00000000;
    local_4188._0_8_ = (CTX->illegal_callback).fn;
    local_4188._8_8_ = (CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_00152405;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = &local_4190;
  }
  else {
    test_ecdsa_edge_cases_cold_37();
LAB_001523f6:
    test_ecdsa_edge_cases_cold_38();
LAB_001523fb:
    test_ecdsa_edge_cases_cold_81();
LAB_00152400:
    test_ecdsa_edge_cases_cold_39();
    psVar13 = extraout_RAX_12;
LAB_00152405:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_normalize
                     (psVar13,(secp256k1_ecdsa_signature *)0x0,(secp256k1_ecdsa_signature *)0x0);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4188._0_8_;
    (psVar13->illegal_callback).data = (void *)local_4188._8_8_;
    if ((int)local_4190 != 1) goto LAB_0015242a;
    local_4190 = local_4190 & 0xffffffff00000000;
    local_4188._0_8_ = (psVar13->illegal_callback).fn;
    local_4188._8_8_ = (psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_0015242f;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = &local_4190;
  }
  else {
    test_ecdsa_edge_cases_cold_40();
LAB_0015242a:
    test_ecdsa_edge_cases_cold_41();
    psVar13 = extraout_RAX_13;
LAB_0015242f:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_serialize_compact
                     (psVar13,(uchar *)0x0,(secp256k1_ecdsa_signature *)&local_40a8);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4188._0_8_;
    (psVar13->illegal_callback).data = (void *)local_4188._8_8_;
    if ((int)local_4190 != 1) goto LAB_00152454;
    local_4190 = local_4190 & 0xffffffff00000000;
    local_4188._0_8_ = (psVar13->illegal_callback).fn;
    local_4188._8_8_ = (psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_00152459;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = &local_4190;
  }
  else {
    test_ecdsa_edge_cases_cold_42();
LAB_00152454:
    test_ecdsa_edge_cases_cold_43();
    psVar13 = extraout_RAX_14;
LAB_00152459:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_serialize_compact
                     (psVar13,(uchar *)local_4038,(secp256k1_ecdsa_signature *)0x0);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4188._0_8_;
    (psVar13->illegal_callback).data = (void *)local_4188._8_8_;
    if ((int)local_4190 != 1) goto LAB_0015247e;
    iVar11 = secp256k1_ecdsa_signature_serialize_compact
                       (psVar13,(uchar *)local_4038,(secp256k1_ecdsa_signature *)&local_40a8);
    psVar13 = CTX;
    if (iVar11 == 0) goto LAB_00152483;
    local_4190 = local_4190 & 0xffffffff00000000;
    local_4188._0_8_ = (CTX->illegal_callback).fn;
    local_4188._8_8_ = (CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_00152488;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = &local_4190;
  }
  else {
    test_ecdsa_edge_cases_cold_44();
LAB_0015247e:
    test_ecdsa_edge_cases_cold_45();
LAB_00152483:
    test_ecdsa_edge_cases_cold_80();
    psVar13 = extraout_RAX_15;
LAB_00152488:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_parse_compact
                     (psVar13,(secp256k1_ecdsa_signature *)0x0,(uchar *)local_4038);
  psVar13 = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4188._0_8_;
    (psVar13->illegal_callback).data = (void *)local_4188._8_8_;
    if ((int)local_4190 != 1) goto LAB_001524ad;
    local_4190 = local_4190 & 0xffffffff00000000;
    local_4188._0_8_ = (psVar13->illegal_callback).fn;
    local_4188._8_8_ = (psVar13->illegal_callback).data;
    if (secp256k1_context_static == psVar13) goto LAB_001524b2;
    (psVar13->illegal_callback).fn = counting_callback_fn;
    (psVar13->illegal_callback).data = &local_4190;
  }
  else {
    test_ecdsa_edge_cases_cold_46();
LAB_001524ad:
    test_ecdsa_edge_cases_cold_47();
    psVar13 = extraout_RAX_16;
LAB_001524b2:
    (*(psVar13->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
    psVar13 = CTX;
  }
  iVar11 = secp256k1_ecdsa_signature_parse_compact
                     (psVar13,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0);
  ctx = CTX;
  if (iVar11 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4188._0_8_;
    (ctx->illegal_callback).data = (void *)local_4188._8_8_;
    if ((int)local_4190 != 1) goto LAB_001524d7;
    iVar11 = secp256k1_ecdsa_signature_parse_compact
                       (ctx,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)local_4038);
    if (iVar11 == 0) goto LAB_001524dc;
    local_4038[0].y.n[0]._0_4_ = 0xffffffff;
    local_4038[0].y.n[0]._4_4_ = 0xffffffff;
    local_4038[0].y.n[1]._0_4_ = 0xffffffff;
    local_4038[0].y.n[1]._4_4_ = 0xffffffff;
    local_4038[0].x.n[4] = 0xffffffffffffffff;
    local_4038[0].x.magnitude = -1;
    local_4038[0].x.normalized = -1;
    local_4038[0].x.n[2] = 0xffffffffffffffff;
    local_4038[0].x.n[3] = 0xffffffffffffffff;
    local_4038[0].x.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[1] = 0xffffffffffffffff;
    ctx = CTX;
    iVar11 = secp256k1_ecdsa_signature_parse_compact
                       (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)local_4038);
    if (iVar11 == 0) {
      unaff_RBP = (uint64_t *)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      do {
        local_4120 = "";
        if ((char)unaff_RBP != '\0') {
          local_4120 = (uchar *)0x0;
        }
        _local_4148 = (undefined1  [16])0x0;
        auStack_4138._0_15_ = SUB1615((undefined1  [16])0x0,0);
        auStack_4138[0xf] = 1;
        local_4168._8_4_ = 0xffffffff;
        local_4168._0_8_ = 0xffffffffffffffff;
        local_4168._12_4_ = 0xffffffff;
        auStack_4158._8_4_ = 0xffffffff;
        auStack_4158._0_8_ = 0xffffffffffffffff;
        auStack_4158._12_4_ = 0xffffffff;
        iVar11 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,local_4168,
                            (secp256k1_nonce_function)0x0,local_4120);
        if (iVar11 != 0) goto LAB_001520f8;
        lVar12 = 0;
        do {
          cVar2 = *(char *)((long)local_40a8.x.n + lVar12);
          if (cVar2 != '\0') break;
          bVar17 = lVar12 != 0x3f;
          lVar12 = lVar12 + 1;
        } while (bVar17);
        if (cVar2 != '\0') goto LAB_001520fd;
        auStack_4158 = (undefined1  [16])0x0;
        local_4168 = (undefined1  [16])0x0;
        iVar11 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,local_4168,
                            (secp256k1_nonce_function)0x0,local_4120);
        if (iVar11 != 0) goto LAB_00152102;
        lVar12 = 0;
        do {
          cVar2 = *(char *)((long)local_40a8.x.n + lVar12);
          if (cVar2 != '\0') break;
          bVar17 = lVar12 != 0x3f;
          lVar12 = lVar12 + 1;
        } while (bVar17);
        if (cVar2 != '\0') goto LAB_00152107;
        auStack_4158[0xf] = 1;
        iVar11 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,local_4168,
                            nonce_function_test_fail,local_4120);
        if (iVar11 != 0) goto LAB_0015210c;
        lVar12 = 0;
        do {
          cVar2 = *(char *)((long)local_40a8.x.n + lVar12);
          if (cVar2 != '\0') break;
          bVar17 = lVar12 != 0x3f;
          lVar12 = lVar12 + 1;
        } while (bVar17);
        if (cVar2 != '\0') goto LAB_00152111;
        iVar11 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4148,local_4168,
                            nonce_function_test_retry,local_4120);
        if (iVar11 != 1) goto LAB_00152116;
        lVar12 = 0;
        do {
          cVar2 = *(char *)((long)local_40a8.x.n + lVar12);
          if (cVar2 != '\0') break;
          bVar17 = lVar12 != 0x3f;
          lVar12 = lVar12 + 1;
        } while (bVar17);
        if (cVar2 == '\0') goto LAB_0015211b;
        pcVar15 = nonce_function_rfc6979;
        ctx = CTX;
        iVar11 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4118,local_4148,local_4168,
                            nonce_function_rfc6979,local_4120);
        if (iVar11 != 1) goto LAB_00152120;
        lVar12 = 0;
        do {
          pcVar1 = local_4118 + lVar12;
          if (*pcVar1 != '\0') break;
          bVar17 = lVar12 != 0x3f;
          lVar12 = lVar12 + 1;
        } while (bVar17);
        if (*pcVar1 == '\0') goto LAB_00152125;
        lVar12 = 0;
        do {
          if (*(char *)((long)local_40a8.x.n + lVar12) != local_4118[lVar12]) goto LAB_001524e6;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x40);
        iVar11 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4118,local_4148,local_4168,
                            (secp256k1_nonce_function)0x0,local_4120);
        if (iVar11 != 1) goto LAB_0015212a;
        lVar12 = 0;
        do {
          pcVar1 = local_4118 + lVar12;
          if (*pcVar1 != '\0') break;
          bVar17 = lVar12 != 0x3f;
          lVar12 = lVar12 + 1;
        } while (bVar17);
        if (*pcVar1 == '\0') goto LAB_0015212f;
        lVar12 = 0;
        do {
          cVar2 = *(char *)((long)local_40a8.x.n + lVar12);
          pcVar1 = local_4118 + lVar12;
          if (cVar2 != *pcVar1) break;
          bVar17 = lVar12 != 0x3f;
          lVar12 = lVar12 + 1;
        } while (bVar17);
        if (cVar2 != *pcVar1) goto LAB_00152134;
        local_40cc = (uint)unaff_RBP;
        lVar12 = 0;
        do {
          local_4148[0] = (char)lVar12;
          iVar11 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4118,local_4148,local_4168,
                              (secp256k1_nonce_function)0x0,local_4120);
          if (iVar11 != 1) {
            test_ecdsa_edge_cases_cold_62();
LAB_001520e9:
            test_ecdsa_edge_cases_cold_75();
            goto LAB_001520ee;
          }
          lVar16 = 0;
          do {
            pcVar1 = local_4118 + lVar16;
            if (*pcVar1 != '\0') break;
            bVar17 = lVar16 != 0x3f;
            lVar16 = lVar16 + 1;
          } while (bVar17);
          if (*pcVar1 == '\0') goto LAB_001520e9;
          local_4038[0].x.n[lVar12 * 4 + 2] = local_4108;
          local_4038[0].x.n[lVar12 * 4 + 3] = uStack_4100;
          local_4038[0].x.n[lVar12 * 4] = _local_4118;
          local_4038[0].x.n[lVar12 * 4 + 1] = auStack_4114._4_8_;
          if (lVar12 != 0) {
            unaff_RBP = local_4038[0].x.n + lVar12 * 4;
            r_00 = local_4038;
            lVar16 = lVar12;
            do {
              secp256k1_scalar_verify((secp256k1_scalar *)unaff_RBP);
              secp256k1_scalar_verify((secp256k1_scalar *)r_00);
              if ((((*unaff_RBP == (r_00->x).n[0]) &&
                   (local_4038[0].x.n[lVar12 * 4 + 1] == (r_00->x).n[1])) &&
                  (local_4038[0].x.n[lVar12 * 4 + 2] == (r_00->x).n[2])) &&
                 (local_4038[0].x.n[lVar12 * 4 + 3] == (r_00->x).n[3])) goto LAB_00151fd2;
              r_00 = (secp256k1_gej *)((r_00->x).n + 4);
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x100);
        auVar9[0xf] = 0;
        auVar9._0_15_ = stack0xffffffffffffbeb9;
        _local_4148 = auVar9 << 8;
        auStack_4138[0xf] = 2;
        lVar16 = 0x100;
        lVar12 = 0x2000;
        do {
          local_4168[0] = (char)lVar16;
          iVar11 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4118,local_4148,local_4168,
                              (secp256k1_nonce_function)0x0,local_4120);
          if (iVar11 != 1) goto LAB_001520ee;
          lVar14 = 0;
          do {
            pcVar1 = local_4118 + lVar14;
            if (*pcVar1 != '\0') break;
            bVar17 = lVar14 != 0x3f;
            lVar14 = lVar14 + 1;
          } while (bVar17);
          if (*pcVar1 == '\0') goto LAB_001520f3;
          unaff_RBP = local_4038[0].x.n + lVar16 * 4;
          local_4038[0].x.n[lVar16 * 4 + 2] = local_4108;
          local_4038[0].x.n[lVar16 * 4 + 3] = uStack_4100;
          *unaff_RBP = _local_4118;
          local_4038[0].x.n[lVar16 * 4 + 1] = auStack_4114._4_8_;
          lVar14 = 0;
          do {
            r_01 = (secp256k1_scalar *)((long)local_4038[0].x.n + lVar14);
            secp256k1_scalar_verify((secp256k1_scalar *)unaff_RBP);
            secp256k1_scalar_verify(r_01);
            if (((*unaff_RBP == r_01->d[0]) &&
                (local_4038[0].x.n[lVar16 * 4 + 1] ==
                 *(uint64_t *)((long)local_4038[0].x.n + lVar14 + 8))) &&
               ((local_4038[0].x.n[lVar16 * 4 + 2] ==
                 *(uint64_t *)((long)local_4038[0].x.n + lVar14 + 0x10) &&
                (local_4038[0].x.n[lVar16 * 4 + 3] ==
                 *(uint64_t *)((long)local_4038[0].x.n + lVar14 + 0x18))))) goto LAB_00151fcd;
            lVar14 = lVar14 + 0x20;
          } while (lVar12 != lVar14);
          lVar16 = lVar16 + 1;
          lVar12 = lVar12 + 0x20;
        } while (lVar16 != 0x200);
        unaff_RBP = (uint64_t *)0x0;
      } while ((local_40cc & 1) != 0);
      local_4108 = 0;
      uStack_4100 = 0;
      _local_4118 = (undefined1  [16])0x0;
      lVar12 = 0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uStack_4140;
      _local_4148 = auVar10 << 0x40;
      local_4188._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
      local_40c8[0] = 0;
      local_4038[0].x.n[0] = 0x4d430001;
      local_4038[0].x.n[1] = (uint64_t)local_40c8;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4190 = 0;
      nonce_function_rfc6979(local_4168,local_4118,local_4118,(uchar *)0x0,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4190 = 0;
      local_4038[0].x.n[1] = (uint64_t)local_4168;
      nonce_function_rfc6979(local_4148,local_4118,local_4118,local_4118,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4190 = 0;
      local_4038[0].x.n[1] = (uint64_t)local_4148;
      nonce_function_rfc6979(local_4188,local_4118,local_4118,(uchar *)0x0,local_4118,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4190 = 0;
      local_4038[0].x.n[1] = (uint64_t)local_4188;
      nonce_function_rfc6979((uchar *)local_40c8,local_4118,local_4118,local_4118,local_4118,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[1] = (uint64_t)local_40c8;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4190 = 0;
      goto LAB_00151fb3;
    }
  }
  else {
    test_ecdsa_edge_cases_cold_48();
    ctx = psVar13;
LAB_001524d7:
    test_ecdsa_edge_cases_cold_49();
LAB_001524dc:
    test_ecdsa_edge_cases_cold_79();
  }
  test_ecdsa_edge_cases_cold_50();
LAB_001524e6:
  test_ecdsa_edge_cases_cold_59();
  goto LAB_001524eb;
LAB_001520ee:
  test_ecdsa_edge_cases_cold_64();
LAB_001520f3:
  test_ecdsa_edge_cases_cold_74();
LAB_001520f8:
  test_ecdsa_edge_cases_cold_51();
LAB_001520fd:
  test_ecdsa_edge_cases_cold_52();
LAB_00152102:
  test_ecdsa_edge_cases_cold_53();
LAB_00152107:
  test_ecdsa_edge_cases_cold_54();
LAB_0015210c:
  test_ecdsa_edge_cases_cold_55();
LAB_00152111:
  test_ecdsa_edge_cases_cold_56();
LAB_00152116:
  test_ecdsa_edge_cases_cold_57();
LAB_0015211b:
  test_ecdsa_edge_cases_cold_78();
LAB_00152120:
  test_ecdsa_edge_cases_cold_58();
LAB_00152125:
  test_ecdsa_edge_cases_cold_77();
LAB_0015212a:
  test_ecdsa_edge_cases_cold_60();
LAB_0015212f:
  test_ecdsa_edge_cases_cold_76();
LAB_00152134:
  test_ecdsa_edge_cases_cold_61();
LAB_00152139:
  test_ecdsa_edge_cases_cold_1();
LAB_0015213e:
  test_ecdsa_edge_cases_cold_101();
LAB_00152143:
  r = (secp256k1_ge *)local_4148;
  test_ecdsa_edge_cases_cold_2();
LAB_00152148:
  test_ecdsa_edge_cases_cold_100();
LAB_0015214d:
  test_ecdsa_edge_cases_cold_3();
LAB_00152152:
  test_ecdsa_edge_cases_cold_99();
LAB_00152157:
  test_ecdsa_edge_cases_cold_98();
LAB_0015215c:
  test_ecdsa_edge_cases_cold_97();
LAB_00152161:
  test_ecdsa_edge_cases_cold_96();
LAB_00152166:
  test_ecdsa_edge_cases_cold_95();
LAB_0015216b:
  test_ecdsa_edge_cases_cold_94();
LAB_00152170:
  test_ecdsa_edge_cases_cold_4();
LAB_00152175:
  test_ecdsa_edge_cases_cold_5();
LAB_0015217a:
  test_ecdsa_edge_cases_cold_93();
LAB_0015217f:
  test_ecdsa_edge_cases_cold_92();
LAB_00152184:
  test_ecdsa_edge_cases_cold_91();
LAB_00152189:
  test_ecdsa_edge_cases_cold_90();
LAB_0015218e:
  test_ecdsa_edge_cases_cold_89();
LAB_00152193:
  test_ecdsa_edge_cases_cold_88();
LAB_00152198:
  test_ecdsa_edge_cases_cold_6();
LAB_0015219d:
  test_ecdsa_edge_cases_cold_7();
LAB_001521a2:
  test_ecdsa_edge_cases_cold_87();
LAB_001521a7:
  test_ecdsa_edge_cases_cold_86();
LAB_001521ac:
  test_ecdsa_edge_cases_cold_85();
LAB_001521b1:
  test_ecdsa_edge_cases_cold_8();
LAB_001521b6:
  test_ecdsa_edge_cases_cold_9();
LAB_001521bb:
  test_ecdsa_edge_cases_cold_10();
LAB_001521c0:
  test_ecdsa_edge_cases_cold_11();
  psVar13 = extraout_RAX;
LAB_001521c5:
  (*(psVar13->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar13->illegal_callback).data);
  psVar13 = CTX;
  goto LAB_00150e52;
  while (lVar12 = lVar12 + 1, lVar12 != 0x20) {
LAB_00151fb3:
    if (local_4168[lVar12] != local_4148[lVar12]) goto LAB_00151fd7;
  }
  test_ecdsa_edge_cases_cold_73();
LAB_00151fcd:
  test_ecdsa_edge_cases_cold_65();
LAB_00151fd2:
  test_ecdsa_edge_cases_cold_63();
LAB_00151fd7:
  lVar12 = 0;
  do {
    if (local_4168[lVar12] != local_4188[lVar12]) goto LAB_00151ff1;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x20);
  test_ecdsa_edge_cases_cold_72();
LAB_00151ff1:
  lVar12 = 0;
  do {
    if (local_4168[lVar12] != *(char *)((long)local_40c8 + lVar12)) goto LAB_0015200e;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x20);
  test_ecdsa_edge_cases_cold_71();
LAB_0015200e:
  lVar12 = 0;
  do {
    if (local_4148[lVar12] != local_4188[lVar12]) goto LAB_00152028;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x20);
  test_ecdsa_edge_cases_cold_70();
LAB_00152028:
  lVar12 = 0;
  do {
    if (local_4148[lVar12] != *(char *)((long)local_40c8 + lVar12)) goto LAB_00152045;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x20);
  test_ecdsa_edge_cases_cold_69();
LAB_00152045:
  lVar12 = 0;
  do {
    if (local_4188[lVar12] != *(char *)((long)local_40c8 + lVar12)) goto LAB_00152062;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x20);
  test_ecdsa_edge_cases_cold_68();
LAB_00152062:
  local_4108._0_1_ = 0xba;
  local_4108._1_1_ = 0xae;
  local_4108._2_1_ = 0xdc;
  local_4108._3_1_ = 0xe6;
  local_4108._4_1_ = 0xaf;
  local_4108._5_1_ = 'H';
  local_4108._6_1_ = 0xa0;
  local_4108._7_1_ = ';';
  uStack_4100._0_1_ = 0xbf;
  uStack_4100._1_1_ = 0xd2;
  uStack_4100._2_1_ = '^';
  uStack_4100._3_1_ = 0x8c;
  uStack_4100._4_1_ = 0xd0;
  uStack_4100._5_1_ = '6';
  uStack_4100._6_1_ = 'A';
  uStack_4100._7_1_ = 'A';
  auStack_4114[4] = 0xff;
  auStack_4114[5] = 0xff;
  auStack_4114[6] = 0xff;
  auStack_4114[7] = 0xff;
  auStack_4114[8] = 0xff;
  auStack_4114[9] = 0xff;
  auStack_4114[10] = 0xff;
  auStack_4114[0xb] = 0xfe;
  local_4118[0] = 0xff;
  local_4118[1] = 0xff;
  local_4118[2] = 0xff;
  local_4118[3] = 0xff;
  auStack_4114[0] = 0xff;
  auStack_4114[1] = 0xff;
  auStack_4114[2] = 0xff;
  auStack_4114[3] = 0xff;
  pcVar15 = (code *)0x0;
  ctx = CTX;
  iVar11 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4168,local_4118,0);
  if (iVar11 == 0) {
    pcVar15 = (code *)0x1;
    ctx = CTX;
    iVar11 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4168,local_4118,1);
    if (iVar11 == 0) {
      return;
    }
  }
  else {
LAB_001524eb:
    test_ecdsa_edge_cases_cold_66();
  }
  test_ecdsa_edge_cases_cold_67();
  uVar3 = *(undefined8 *)pcVar15;
  uVar4 = *(uint64_t *)(pcVar15 + 8);
  uVar5 = *(uint64_t *)(pcVar15 + 0x18);
  (ctx->ecmult_gen_ctx).scalar_offset.d[1] = *(uint64_t *)(pcVar15 + 0x10);
  (ctx->ecmult_gen_ctx).scalar_offset.d[2] = uVar5;
  *(undefined8 *)&ctx->ecmult_gen_ctx = uVar3;
  (ctx->ecmult_gen_ctx).scalar_offset.d[0] = uVar4;
  return;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, NULL));
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey));
        siglen = 72;
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen));
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL));
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}